

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::MinTypMaxExpression>
          (ConstraintExprVisitor *this,MinTypMaxExpression *expr)

{
  BinaryOperator BVar1;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange sourceRange_06;
  SourceRange sourceRange_07;
  VariableSymbol *pVVar2;
  bool bVar3;
  SubroutineKind SVar4;
  BinaryExpression *pBVar5;
  DistExpression *this_00;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar6;
  Type *pTVar7;
  Diagnostic *diag;
  byte local_1aa;
  byte local_1a9;
  bitmask<slang::ast::VariableFlags> local_162;
  FormalArgumentSymbol *local_160;
  FormalArgumentSymbol *arg;
  iterator __end6;
  iterator __begin6;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *local_138;
  ArgList *__range6;
  SubroutineSymbol *sub;
  Symbol *local_120;
  undefined4 local_114;
  CallExpression *local_110;
  CallExpression *call;
  SourceLocation local_100;
  undefined4 local_f4;
  Expression *local_f0;
  Expression *left;
  DistVarVisitor distVisitor;
  undefined1 local_a8 [56];
  Scope *local_70;
  Symbol *local_68;
  undefined4 local_5c;
  Scope *local_58;
  Symbol *local_50;
  undefined4 local_44;
  Scope *local_40;
  Symbol *local_38;
  undefined4 local_30;
  RandMode local_2c;
  Symbol *pSStack_28;
  RandMode mode;
  Symbol *sym;
  MinTypMaxExpression *expr_local;
  ConstraintExprVisitor *this_local;
  
  if ((this->failed & 1U) != 0) {
    return false;
  }
  sym = (Symbol *)expr;
  expr_local = (MinTypMaxExpression *)this;
  if ((((this->isSoft & 1U) != 0) &&
      (pSStack_28 = Expression::getSymbolReference(&expr->super_Expression,true),
      pSStack_28 != (Symbol *)0x0)) &&
     (local_2c = ASTContext::getRandMode(this->context,pSStack_28), local_2c == RandC)) {
    local_30 = 0x340008;
    local_40 = sym->parentScope;
    local_38 = sym->nextInScope;
    sourceRange.startLoc = (SourceLocation)sym->parentScope;
    sourceRange.endLoc = (SourceLocation)sym->nextInScope;
    ASTContext::addDiag(this->context,(DiagCode)0x340008,sourceRange);
  }
  if (((sym->kind != PackedUnionType) && (sym->kind != ClassType)) && (sym->kind != CovergroupType))
  {
    MinTypMaxExpression::visitExprs<slang::ast::ConstraintExprVisitor&>
              ((MinTypMaxExpression *)sym,this);
  }
  switch(sym->kind) {
  case Root:
    Expression::as<slang::ast::IntegerLiteral>((Expression *)sym);
    IntegerLiteral::getValue((IntegerLiteral *)(local_a8 + 0x28));
    bVar3 = SVInt::hasUnknown((SVInt *)(local_a8 + 0x28));
    SVInt::~SVInt((SVInt *)(local_a8 + 0x28));
    if (bVar3) {
      local_a8._36_4_ = 0x490008;
      local_a8._16_8_ = sym->parentScope;
      local_a8._24_8_ = sym->nextInScope;
      sourceRange_02.startLoc = (SourceLocation)sym->parentScope;
      sourceRange_02.endLoc = (SourceLocation)sym->nextInScope;
      ASTContext::addDiag(this->context,(DiagCode)0x490008,sourceRange_02);
      this_local._7_1_ = visitInvalid(this,(Expression *)sym);
    }
    else {
      this_local._7_1_ = true;
    }
    break;
  case CompilationUnit:
  case DeferredMember:
    local_5c = 0x2a0008;
    local_70 = sym->parentScope;
    local_68 = sym->nextInScope;
    sourceRange_01.startLoc = (SourceLocation)sym->parentScope;
    sourceRange_01.endLoc = (SourceLocation)sym->nextInScope;
    ASTContext::addDiag(this->context,(DiagCode)0x2a0008,sourceRange_01);
    this_local._7_1_ = visitInvalid(this,(Expression *)sym);
    break;
  case TransparentMember:
    Expression::as<slang::ast::UnbasedUnsizedIntegerLiteral>((Expression *)sym);
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)local_a8);
    bVar3 = SVInt::hasUnknown((SVInt *)local_a8);
    SVInt::~SVInt((SVInt *)local_a8);
    if (bVar3) {
      sourceRange_03.startLoc = (SourceLocation)sym->parentScope;
      sourceRange_03.endLoc = (SourceLocation)sym->nextInScope;
      ASTContext::addDiag(this->context,(DiagCode)0x490008,sourceRange_03);
      this_local._7_1_ = visitInvalid(this,(Expression *)sym);
    }
    else {
      this_local._7_1_ = true;
    }
    break;
  default:
    goto LAB_003dd5a2;
  case PackedArrayType:
    pBVar5 = Expression::as<slang::ast::BinaryExpression>((Expression *)sym);
    BVar1 = pBVar5->op;
    if ((BVar1 - CaseEquality < 2) || (BVar1 == WildcardEquality || BVar1 == WildcardInequality)) {
      distVisitor._8_8_ = sym->parentScope;
      sourceRange_04.startLoc = (SourceLocation)sym->parentScope;
      sourceRange_04.endLoc = (SourceLocation)sym->nextInScope;
      ASTContext::addDiag(this->context,(DiagCode)0x130008,sourceRange_04);
      bVar3 = visitInvalid(this,(Expression *)sym);
      return bVar3;
    }
    goto LAB_003dd5a2;
  case UnpackedStructType:
  case TypeAlias:
  case ErrorType:
  case NetType:
    local_44 = 0x130008;
    local_58 = sym->parentScope;
    local_50 = sym->nextInScope;
    sourceRange_00.startLoc = (SourceLocation)sym->parentScope;
    sourceRange_00.endLoc = (SourceLocation)sym->nextInScope;
    ASTContext::addDiag(this->context,(DiagCode)0x130008,sourceRange_00);
    this_local._7_1_ = visitInvalid(this,(Expression *)sym);
    break;
  case CovergroupType:
    local_110 = Expression::as<slang::ast::CallExpression>((Expression *)sym);
    SVar4 = CallExpression::getSubroutineKind(local_110);
    if (SVar4 == Task) {
      local_114 = 0x440008;
      sub = (SubroutineSymbol *)sym->parentScope;
      local_120 = sym->nextInScope;
      sourceRange_05.startLoc = (SourceLocation)sym->parentScope;
      sourceRange_05.endLoc = (SourceLocation)sym->nextInScope;
      ASTContext::addDiag(this->context,(DiagCode)0x440008,sourceRange_05);
      bVar3 = visitInvalid(this,(Expression *)sym);
      return bVar3;
    }
    bVar3 = CallExpression::isSystemCall(local_110);
    if (!bVar3) {
      ppSVar6 = std::
                get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          (&local_110->subroutine);
      __range6 = (ArgList *)*ppSVar6;
      ___begin6 = SubroutineSymbol::getArguments((SubroutineSymbol *)__range6);
      local_138 = (span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                  &__begin6;
      __end6 = nonstd::span_lite::
               span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                         (local_138);
      arg = (FormalArgumentSymbol *)
            nonstd::span_lite::
            span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                      (local_138);
      for (; (FormalArgumentSymbol *)__end6 != arg; __end6 = __end6 + 1) {
        local_160 = *__end6;
        local_1a9 = 1;
        if (local_160->direction != Out) {
          local_1aa = 0;
          if (local_160->direction == Ref) {
            pVVar2 = &local_160->super_VariableSymbol;
            bitmask<slang::ast::VariableFlags>::bitmask(&local_162,Const);
            bVar3 = bitmask<slang::ast::VariableFlags>::has(&pVVar2->flags,&local_162);
            local_1aa = bVar3 ^ 0xff;
          }
          local_1a9 = local_1aa;
        }
        if ((local_1a9 & 1) != 0) {
          sourceRange_06.startLoc = (SourceLocation)sym->parentScope;
          sourceRange_06.endLoc = (SourceLocation)sym->nextInScope;
          ASTContext::addDiag(this->context,(DiagCode)0x2d0008,sourceRange_06);
          bVar3 = visitInvalid(this,(Expression *)sym);
          return bVar3;
        }
      }
    }
LAB_003dd5a2:
    pTVar7 = not_null<const_slang::ast::Type_*>::operator->
                       ((not_null<const_slang::ast::Type_*> *)&sym->name);
    bVar3 = Type::isValidForRand(pTVar7,Rand);
    if (bVar3) {
      this_local._7_1_ = true;
    }
    else {
      sourceRange_07.startLoc = (SourceLocation)sym->parentScope;
      sourceRange_07.endLoc = (SourceLocation)sym->nextInScope;
      diag = ASTContext::addDiag(this->context,(DiagCode)0x290008,sourceRange_07);
      pTVar7 = not_null<const_slang::ast::Type_*>::operator*
                         ((not_null<const_slang::ast::Type_*> *)&sym->name);
      ast::operator<<(diag,pTVar7);
      this_local._7_1_ = visitInvalid(this,(Expression *)sym);
    }
    break;
  case PropertyType:
    this_local._7_1_ = true;
    break;
  case VirtualInterfaceType:
    DistVarVisitor::DistVarVisitor((DistVarVisitor *)&left,this->context);
    this_00 = Expression::as<slang::ast::DistExpression>((Expression *)sym);
    local_f0 = DistExpression::left(this_00);
    Expression::visit<slang::ast::DistVarVisitor&>(local_f0,(DistVarVisitor *)&left);
    if (((byte)distVisitor.context & 1) == 0) {
      local_f4 = 0x370008;
      call = *(CallExpression **)&(local_f0->sourceRange).startLoc;
      local_100 = (local_f0->sourceRange).endLoc;
      ASTContext::addDiag(this->context,(DiagCode)0x370008,local_f0->sourceRange);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool visit(const T& expr) {
        if (failed)
            return false;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (isSoft) {
                if (auto sym = expr.getSymbolReference()) {
                    RandMode mode = context.getRandMode(*sym);
                    if (mode == RandMode::RandC)
                        context.addDiag(diag::RandCInSoft, expr.sourceRange);
                }
            }

            if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {
                    expr.visitExprs(*this);
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    switch (expr.template as<BinaryExpression>().op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return visitInvalid(expr);
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::OpenRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return visitInvalid(expr);
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return visitInvalid(expr);
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!expr.type->isValidForRand(RandMode::Rand)) {
                context.addDiag(diag::NonIntegralConstraintExpr, expr.sourceRange) << *expr.type;
                return visitInvalid(expr);
            }
        }

        return true;
    }